

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.h
# Opt level: O2

FSerializer * __thiscall
FSerializer::Array<side_t>
          (FSerializer *this,char *key,side_t *obj,side_t *def,int count,bool fullcompare)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  side_t *def_00;
  side_t *psVar4;
  undefined3 in_register_00000089;
  ulong uVar5;
  
  if ((((CONCAT31(in_register_00000089,fullcompare) != 0) && (!save_full)) && (def != (side_t *)0x0)
      ) && ((this->w != (FWriter *)0x0 && (iVar2 = bcmp(obj,def,(long)count * 0xc0), iVar2 == 0))))
  {
    return this;
  }
  bVar1 = BeginArray(this,key);
  if (bVar1) {
    if ((this->r != (FReader *)0x0) && (uVar3 = ArraySize(this), (int)uVar3 < count)) {
      count = uVar3;
    }
    if (count < 1) {
      count = 0;
    }
    uVar5 = (ulong)(uint)count;
    psVar4 = def;
    while (bVar1 = uVar5 != 0, uVar5 = uVar5 - 1, bVar1) {
      def_00 = psVar4;
      if (def == (side_t *)0x0) {
        def_00 = def;
      }
      ::Serialize(this,(char *)0x0,obj,def_00);
      psVar4 = psVar4 + 1;
      obj = obj + 1;
    }
    EndArray(this);
  }
  return this;
}

Assistant:

FSerializer &Array(const char *key, T *obj, T *def, int count, bool fullcompare = false)
	{
		if (!save_full && fullcompare && isWriting() && def != nullptr && !memcmp(obj, def, count * sizeof(T)))
		{
			return *this;
		}
		if (BeginArray(key))
		{
			if (isReading())
			{
				int max = ArraySize();
				if (max < count) count = max;
			}
			for (int i = 0; i < count; i++)
			{
				Serialize(*this, nullptr, obj[i], def ? &def[i] : nullptr);
			}
			EndArray();
		}
		return *this;
	}